

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
find_key(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
         *this,int *key)

{
  int iVar1;
  uint uVar2;
  
  this->num_lookups_ = this->num_lookups_ + 1;
  iVar1 = predict_position(this,key);
  iVar1 = exponential_search_upper_bound<int>(this,iVar1,key);
  uVar2 = 0xffffffff;
  if (0 < iVar1) {
    if ((*key <= this->key_slots_[iVar1 - 1U]) && (this->key_slots_[iVar1 - 1U] <= *key)) {
      uVar2 = iVar1 - 1U;
    }
  }
  return uVar2;
}

Assistant:

int find_key(const T& key) {
    num_lookups_++;
    int predicted_pos = predict_position(key);

    // The last key slot with a certain value is guaranteed to be a real key
    // (instead of a gap)
    int pos = exponential_search_upper_bound(predicted_pos, key) - 1;
    if (pos < 0 || !key_equal(ALEX_DATA_NODE_KEY_AT(pos), key)) {
      return -1;
    } else {
      return pos;
    }
  }